

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::RestoreSegueBase(CWriter *this)

{
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  Newline local_39;
  anon_class_8_1_8991fb9c local_38;
  function<void_()> local_30;
  CWriter *local_10;
  CWriter *this_local;
  
  local_38.this = this;
  local_10 = this;
  std::function<void()>::
  function<wabt::(anonymous_namespace)::CWriter::RestoreSegueBase()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  NonIndented(this,&local_30);
  std::function<void_()>::~function(&local_30);
  (anonymous_namespace)::CWriter::Write<char_const(&)[44],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [44])"wasm_rt_segue_write_base(segue_saved_base);",&local_39)
  ;
  local_68.this = this;
  std::function<void()>::
  function<wabt::(anonymous_namespace)::CWriter::RestoreSegueBase()::__1,void>
            ((function<void()> *)&local_60,&local_68);
  NonIndented(this,&local_60);
  std::function<void_()>::~function(&local_60);
  return;
}

Assistant:

void CWriter::RestoreSegueBase() {
  NonIndented([&] {
    Write(
        "#if WASM_RT_USE_SEGUE_FOR_THIS_MODULE && !WASM_RT_SEGUE_FREE_SEGMENT",
        Newline());
  });
  Write("wasm_rt_segue_write_base(segue_saved_base);", Newline());
  NonIndented([&] { Write("#endif", Newline()); });
}